

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int ecjpake_kkp_write(mbedtls_md_type_t md_type,mbedtls_ecp_group *grp,int pf,mbedtls_ecp_point *G,
                     mbedtls_mpi *x,mbedtls_ecp_point *X,char *id,uchar **p,uchar *end,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t local_58;
  size_t len;
  mbedtls_ecp_point *pmStack_48;
  int ret;
  mbedtls_ecp_point *X_local;
  mbedtls_mpi *x_local;
  mbedtls_ecp_point *G_local;
  mbedtls_ecp_group *pmStack_28;
  int pf_local;
  mbedtls_ecp_group *grp_local;
  mbedtls_md_type_t md_type_local;
  
  len._4_4_ = 0xffffff92;
  if (end < *p) {
    grp_local._4_4_ = -0x4f00;
  }
  else {
    pmStack_48 = X;
    X_local = (mbedtls_ecp_point *)x;
    x_local = &G->X;
    G_local._4_4_ = pf;
    pmStack_28 = grp;
    grp_local._0_4_ = md_type;
    len._4_4_ = mbedtls_ecp_gen_keypair_base(grp,G,x,X,f_rng,p_rng);
    if ((len._4_4_ == 0) &&
       (len._4_4_ = mbedtls_ecp_tls_write_point
                              (pmStack_28,pmStack_48,G_local._4_4_,&local_58,*p,(long)end - (long)*p
                              ), len._4_4_ == 0)) {
      *p = *p + local_58;
      len._4_4_ = ecjpake_zkp_write((mbedtls_md_type_t)grp_local,pmStack_28,G_local._4_4_,
                                    (mbedtls_ecp_point *)x_local,&X_local->X,pmStack_48,id,p,end,
                                    f_rng,p_rng);
    }
    grp_local._4_4_ = len._4_4_;
  }
  return grp_local._4_4_;
}

Assistant:

static int ecjpake_kkp_write(const mbedtls_md_type_t md_type,
                             const mbedtls_ecp_group *grp,
                             const int pf,
                             const mbedtls_ecp_point *G,
                             mbedtls_mpi *x,
                             mbedtls_ecp_point *X,
                             const char *id,
                             unsigned char **p,
                             const unsigned char *end,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if (end < *p) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    /* Generate key (7.4.2.3.1) and write it out */
    MBEDTLS_MPI_CHK(mbedtls_ecp_gen_keypair_base((mbedtls_ecp_group *) grp, G, x, X,
                                                 f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_ecp_tls_write_point(grp, X,
                                                pf, &len, *p, end - *p));
    *p += len;

    /* Generate and write proof */
    MBEDTLS_MPI_CHK(ecjpake_zkp_write(md_type, grp, pf, G, x, X, id,
                                      p, end, f_rng, p_rng));

cleanup:
    return ret;
}